

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_grow(bitset_t *bitset,size_t newarraysize)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  uint64_t *puVar4;
  
  _Var2 = false;
  if ((newarraysize >> 0x3a == 0) && (_Var2 = false, bitset->arraysize <= newarraysize)) {
    uVar1 = bitset->capacity;
    if (uVar1 < newarraysize) {
      uVar1 = uVar1 + (uVar1 == 0);
      do {
        uVar3 = uVar1;
        uVar1 = uVar3 * 2;
      } while (uVar3 < newarraysize);
      puVar4 = (uint64_t *)realloc(bitset->array,uVar3 * 8);
      if (puVar4 == (uint64_t *)0x0) {
        return false;
      }
      bitset->capacity = uVar3;
      bitset->array = puVar4;
    }
    memset(bitset->array + bitset->arraysize,0,(newarraysize - bitset->arraysize) * 8);
    bitset->arraysize = newarraysize;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool bitset_grow(bitset_t *bitset,  size_t newarraysize) {
  if(newarraysize < bitset->arraysize) { return false; }
  if(newarraysize > SIZE_MAX/64) { return false; }
  if (bitset->capacity < newarraysize) {
    uint64_t *newarray;
    size_t newcapacity = bitset->capacity;
    if(newcapacity == 0) { newcapacity = 1; }
    while(newcapacity < newarraysize) { newcapacity *= 2; }
    if ((newarray = (uint64_t *) realloc(bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
      return false;
    }
    bitset->capacity = newcapacity;
    bitset->array = newarray;
  }
  memset(bitset->array + bitset->arraysize, 0, sizeof(uint64_t) * (newarraysize - bitset->arraysize));
  bitset->arraysize = newarraysize;
  return true; // success!
}